

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall
booster::locale::date_time::date_time(date_time *this,date_time_period_set *s,calendar *cal)

{
  int iVar1;
  period_mark pVar2;
  abstract_calendar *paVar3;
  undefined4 extraout_var;
  date_time_period_set *this_00;
  date_time_period_set *pdVar4;
  date_time_period *pdVar5;
  date_time_period_set *in_RDX;
  hold_ptr<booster::locale::abstract_calendar> *in_RDI;
  uint i;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar6;
  
  paVar3 = hold_ptr<booster::locale::abstract_calendar>::operator->
                     ((hold_ptr<booster::locale::abstract_calendar> *)(in_RDX + 0x28));
  iVar1 = (**paVar3->_vptr_abstract_calendar)();
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr
            (in_RDI,(abstract_calendar *)CONCAT44(extraout_var,iVar1));
  uVar6 = 0;
  while( true ) {
    this_00 = (date_time_period_set *)(ulong)uVar6;
    pdVar4 = (date_time_period_set *)date_time_period_set::size(this_00);
    if (pdVar4 <= this_00) break;
    paVar3 = hold_ptr<booster::locale::abstract_calendar>::operator->(in_RDI);
    pdVar5 = date_time_period_set::operator[](in_RDX,CONCAT44(uVar6,in_stack_ffffffffffffffe0));
    pVar2 = period::period_type::mark((period_type *)pdVar5);
    pdVar5 = date_time_period_set::operator[](in_RDX,CONCAT44(uVar6,in_stack_ffffffffffffffe0));
    (*paVar3->_vptr_abstract_calendar[1])(paVar3,(ulong)pVar2,(ulong)*(uint *)(pdVar5 + 4));
    uVar6 = uVar6 + 1;
  }
  paVar3 = hold_ptr<booster::locale::abstract_calendar>::operator->(in_RDI);
  (*paVar3->_vptr_abstract_calendar[2])();
  return;
}

Assistant:

date_time::date_time(date_time_period_set const &s,calendar const &cal) :
    impl_(cal.impl_->clone())
{
    for(unsigned i=0;i<s.size();i++) {
        impl_->set_value(s[i].type.mark(),s[i].value);
    }
    impl_->normalize();
}